

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GPUShaderFP64Test7::iterate(GPUShaderFP64Test7 *this)

{
  GLint GVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ContextInfo *pCVar5;
  NotSupportedError *pNVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  size_type sVar9;
  GLint n_used_components;
  uint n_type_components;
  _variable new_variable;
  GLint total_n_used_components;
  _variables variables_to_test;
  undefined1 local_3f8 [4];
  uint n_tested_variables;
  string local_278;
  MessageBuilder local_258;
  string local_d8;
  _variable_type local_b8;
  uint local_b4;
  _variable_type variable_type;
  uint array_size;
  uint n_double_variable_type;
  uint n_double_variable_types;
  _variable_type double_variable_types [13];
  allocator<char> local_69;
  string local_68;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30;
  GPUShaderFP64Test7 *local_10;
  GPUShaderFP64Test7 *this_local;
  
  local_10 = this;
  pCVar5 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_ARB_gpu_shader_fp64");
  if (!bVar2) {
    local_45 = 1;
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_gpu_shader_fp64 is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_30);
    local_45 = 0;
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pCVar5 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_ARB_vertex_attrib_64bit");
  if (!bVar2) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"GL_ARB_vertex_attrib_64bit is not supported.",&local_69);
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_68);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  initTest(this);
  memcpy(&n_double_variable_type,&DAT_029fd4a0,0x34);
  array_size = 0xd;
  for (variable_type = VARIABLE_TYPE_BOOL; variable_type < VARIABLE_TYPE_DMAT4X3;
      variable_type = variable_type + VARIABLE_TYPE_BVEC2) {
    for (local_b4 = 1; local_b4 < 3; local_b4 = local_b4 + 1) {
      local_b8 = (&n_double_variable_type)[variable_type];
      GVar1 = this->m_fs_id;
      getCodeOfFragmentShaderWithDoublePrecisionOutput_abi_cxx11_(&local_d8,this,local_b8,local_b4);
      bVar2 = compileShader(this,GVar1,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      if (bVar2) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_258,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_258,
                            (char (*) [79])
                            "A fragment shader with double-precision output variable compiled successfully."
                           );
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_258);
        this->m_has_test_passed = false;
      }
      GVar1 = this->m_fs_id;
      getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput_abi_cxx11_
                (&local_278,this,local_b8,local_b4);
      bVar2 = compileShader(this,GVar1,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      if (bVar2) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_3f8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_3f8,
                            (char (*) [109])
                            "A fragment shader with double-precision input variables lacking flat layout qualifier compiled successfully."
                           );
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3f8);
        this->m_has_test_passed = false;
      }
    }
  }
  variables_to_test.
  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
  ::vector((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
            *)&new_variable.type);
  do {
    if (variables_to_test.
        super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x1a) {
      if ((this->m_has_test_passed & 1U) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      std::
      vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
      ::~vector((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                 *)&new_variable.type);
      return STOP;
    }
    new_variable.array_size = 0;
    while ((int)new_variable.array_size < this->m_n_max_components_per_stage &&
           variables_to_test.
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0x1a) {
      n_type_components =
           2 - ((variables_to_test.
                 super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 1) == 0);
      new_variable.attribute_location =
           (&n_double_variable_type)
           [variables_to_test.
            super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ >> 1];
      uVar3 = Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType
                        (new_variable.attribute_location);
      iVar4 = uVar3 * 4 * n_type_components * 2;
      if (this->m_n_max_components_per_stage < (int)(new_variable.array_size + iVar4)) {
        if (this->m_n_max_components_per_stage < iVar4) {
          variables_to_test.
          super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               variables_to_test.
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        }
        break;
      }
      new_variable.array_size = new_variable.array_size + iVar4;
      variables_to_test.
      super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           variables_to_test.
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      std::
      vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
      ::push_back((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                   *)&new_variable.type,(value_type *)&n_used_components);
    }
    sVar9 = std::
            vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
            ::size((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                    *)&new_variable.type);
    if (sVar9 != 0) {
      bVar2 = executeFunctionalTest(this,(_variables *)&new_variable.type);
      this->m_has_test_passed = (this->m_has_test_passed & 1U & bVar2) != 0;
      std::
      vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
      ::clear((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               *)&new_variable.type);
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test7::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_vertex_attrib_64bit"))
	{
		throw tcu::NotSupportedError("GL_ARB_vertex_attrib_64bit is not supported.");
	}

	/* Initialize GL objects required to run the test */
	initTest();

	/* Check the negative cases first */
	const Utils::_variable_type double_variable_types[] = {
		Utils::VARIABLE_TYPE_DOUBLE,  Utils::VARIABLE_TYPE_DVEC2, Utils::VARIABLE_TYPE_DVEC3,
		Utils::VARIABLE_TYPE_DVEC4,   Utils::VARIABLE_TYPE_DMAT2, Utils::VARIABLE_TYPE_DMAT2X3,
		Utils::VARIABLE_TYPE_DMAT2X4, Utils::VARIABLE_TYPE_DMAT3, Utils::VARIABLE_TYPE_DMAT3X2,
		Utils::VARIABLE_TYPE_DMAT3X4, Utils::VARIABLE_TYPE_DMAT4, Utils::VARIABLE_TYPE_DMAT4X2,
		Utils::VARIABLE_TYPE_DMAT4X3,
	};
	const unsigned int n_double_variable_types = sizeof(double_variable_types) / sizeof(double_variable_types[0]);

	for (unsigned int n_double_variable_type = 0; n_double_variable_type < n_double_variable_types;
		 ++n_double_variable_type)
	{
		for (unsigned int array_size = 1; array_size < 3; ++array_size)
		{
			Utils::_variable_type variable_type = double_variable_types[n_double_variable_type];

			if (compileShader(m_fs_id, getCodeOfFragmentShaderWithDoublePrecisionOutput(variable_type, array_size)))
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "A fragment shader with double-precision output variable compiled successfully."
								   << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
			}

			if (compileShader(m_fs_id,
							  getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput(variable_type, array_size)))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "A fragment shader with double-precision input variables lacking flat layout qualifier"
					   " compiled successfully."
					<< tcu::TestLog::EndMessage;

				m_has_test_passed = false;
			}
		}
	} /* for (all variable types) */

	/* Execute functional test. Split the run into as many iterations as necessary
	 * so that we do not exceed GL implementation's capabilities. */
	unsigned int n_tested_variables = 0;
	_variables   variables_to_test;

	while (n_tested_variables != n_double_variable_types * 2 /* arrayed & non-arrayed */)
	{
		glw::GLint total_n_used_components = 0;

		/* Use as many variables as possible for the iterations. Do not exceed maximum amount
		 * of varying components that can be used for all shadr stages.
		 */
		while (total_n_used_components < m_n_max_components_per_stage &&
			   n_tested_variables != n_double_variable_types * 2 /* arrayed & non-arrayed */)
		{
			_variable	new_variable;
			unsigned int n_type_components = 0;
			glw::GLint   n_used_components = 0;

			new_variable.array_size =
				((n_tested_variables % 2) == 0) ? 1 /* non-arrayed variable */ : 2; /* arrayed variable */
			new_variable.type = double_variable_types[n_tested_variables / 2];

			/* Double-precision varyings can use twice as many components as single-precision FPs */
			n_type_components = 4 /* components per location */ *
								Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(new_variable.type);
			n_used_components = n_type_components * new_variable.array_size * 2;

			/* Do we have enough space? */
			if (total_n_used_components + n_used_components > m_n_max_components_per_stage)
			{
				if (n_used_components > m_n_max_components_per_stage)
				{ //if the number of components for this variable is larger than the max_components_per_stage, then skip it.
					n_tested_variables++;
				}
				break;
			}

			/* We can safely test the type in current iteration */
			total_n_used_components += n_used_components;
			n_tested_variables++;

			variables_to_test.push_back(new_variable);
		}

		if (variables_to_test.size() > 0)
		{
			m_has_test_passed &= executeFunctionalTest(variables_to_test);

			variables_to_test.clear();
		}
	}

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}